

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int hdr_log_read_entry(hdr_log_reader *reader,FILE *file,hdr_log_entry *entry,
                      hdr_histogram **histogram)

{
  int iVar1;
  size_t output_len;
  int local_6c;
  int c;
  int result;
  uint8_t *compressed_histogram;
  size_t compressed_len;
  char *base64_histogram;
  size_t tag_offset;
  size_t base64_len;
  size_t capacity;
  parse_log_state state;
  hdr_histogram **histogram_local;
  hdr_log_entry *entry_local;
  FILE *file_local;
  hdr_log_reader *reader_local;
  
  capacity._4_4_ = 0;
  base64_len = 0x400;
  tag_offset = 0;
  base64_histogram = (char *)0x0;
  compressed_len = (size_t)calloc(0x400,1);
  _c = (uint8_t *)0x0;
  if (entry == (hdr_log_entry *)0x0) {
    reader_local._4_4_ = -0x16;
  }
  else {
    do {
      switch(capacity._4_4_) {
      case 0:
        iVar1 = fgetc((FILE *)file);
        if (iVar1 == 0x54) {
          iVar1 = read_ahead(file,"ag=",3);
          if (iVar1 == 0) {
            local_6c = -0x16;
            goto LAB_00108a1b;
          }
          capacity._4_4_ = 1;
        }
        else if ((iVar1 < 0x30) || (0x39 < iVar1)) {
          if ((iVar1 != 0xd) && (iVar1 != 10)) {
            if (iVar1 == -1) {
              local_6c = -1;
            }
            else {
              local_6c = -0x16;
            }
            goto LAB_00108a1b;
          }
        }
        else {
          ungetc(iVar1,(FILE *)file);
          capacity._4_4_ = 2;
        }
        break;
      case 1:
        iVar1 = fgetc((FILE *)file);
        if (iVar1 == 0x2c) {
          if ((entry->tag != (char *)0x0) && (base64_histogram < (char *)entry->tag_len)) {
            entry->tag[(long)base64_histogram] = '\0';
          }
          capacity._4_4_ = 2;
        }
        else {
          if (((iVar1 == 0xd) || (iVar1 == 10)) || (iVar1 == -1)) {
            local_6c = -0x16;
            goto LAB_00108a1b;
          }
          if ((entry->tag != (char *)0x0) && (base64_histogram < (char *)entry->tag_len)) {
            entry->tag[(long)base64_histogram] = (char)iVar1;
            base64_histogram = base64_histogram + 1;
          }
        }
        break;
      case 2:
        iVar1 = read_ahead_timestamp(file,&entry->start_timestamp,',');
        if (iVar1 == 0) {
          local_6c = -0x16;
          goto LAB_00108a1b;
        }
        capacity._4_4_ = 3;
        break;
      case 3:
        iVar1 = read_ahead_timestamp(file,&entry->interval,',');
        if (iVar1 == 0) {
          local_6c = -0x16;
          goto LAB_00108a1b;
        }
        capacity._4_4_ = 4;
        break;
      case 4:
        iVar1 = read_ahead_timestamp(file,&entry->max,',');
        if (iVar1 == 0) {
          local_6c = -0x16;
          goto LAB_00108a1b;
        }
        capacity._4_4_ = 5;
        break;
      case 5:
        iVar1 = fgetc((FILE *)file);
        if (((iVar1 == 0xd) || (iVar1 == 10)) || (iVar1 == -1)) {
          capacity._4_4_ = 6;
        }
        else {
          if (tag_offset == base64_len) {
            base64_len = base64_len << 1;
            compressed_len = (size_t)realloc((void *)compressed_len,base64_len);
            if ((void *)compressed_len == (void *)0x0) {
              local_6c = -0xc;
              goto LAB_00108a1b;
            }
          }
          *(char *)(compressed_len + tag_offset) = (char)iVar1;
          tag_offset = tag_offset + 1;
        }
        break;
      default:
        local_6c = -0x16;
        goto LAB_00108a1b;
      }
    } while (capacity._4_4_ != 6);
    _c = (uint8_t *)calloc(tag_offset,1);
    output_len = hdr_base64_decoded_len(tag_offset);
    local_6c = hdr_base64_decode((char *)compressed_len,tag_offset,_c,output_len);
    if (local_6c == 0) {
      local_6c = hdr_decode_compressed(_c,output_len,histogram);
    }
LAB_00108a1b:
    free((void *)compressed_len);
    free(_c);
    reader_local._4_4_ = local_6c;
  }
  return reader_local._4_4_;
}

Assistant:

int hdr_log_read_entry(
    struct hdr_log_reader* reader, FILE* file, struct hdr_log_entry *entry, struct hdr_histogram** histogram)
{
    enum parse_log_state state = INIT;
    size_t capacity = 1024;
    size_t base64_len = 0;
    size_t tag_offset = 0;
    char* base64_histogram = hdr_calloc(capacity, sizeof(char));
    size_t compressed_len = 0;
    uint8_t* compressed_histogram = NULL;
    int result = -EINVAL;

    (void)reader;

    if (NULL == entry)
    {
        return -EINVAL;
    }

    do
    {
        int c;

        switch (state)
        {
            case INIT:
                c = fgetc(file);
                if ('T' == c)
                {
                    if (read_ahead(file, "ag=", 3))
                    {
                        state = TAG;
                    }
                    else
                    {
                        FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                    }
                }
                else if ('0' <= c && c <= '9')
                {
                    ungetc(c, file);
                    state = BEGIN_TIMESTAMP;
                }
                else if ('\r' == c || '\n' == c)
                {
                    /* Skip over trailing/preceding new lines. */
                }
                else if (EOF == c)
                {
                    FAIL_AND_CLEANUP(cleanup, result, EOF);
                }
                else
                {
                    FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                }
                break;
            case TAG:
                c = fgetc(file);
                if (',' == c)
                {
                    if (NULL != entry->tag && tag_offset < entry->tag_len)
                    {
                        entry->tag[tag_offset] = '\0';
                    }
                    state = BEGIN_TIMESTAMP;
                }
                else if ('\r' == c || '\n' == c || EOF == c)
                {
                    FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                }
                else
                {
                    if (NULL != entry->tag && tag_offset < entry->tag_len)
                    {
                        entry->tag[tag_offset] = (char) c;
                        tag_offset++;
                    }
                }
                break;
            case BEGIN_TIMESTAMP:
                if (read_ahead_timestamp(file, &entry->start_timestamp, ','))
                {
                    state = INTERVAL;
                }
                else
                {
                    FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                }
                break;
            case INTERVAL:
                if (read_ahead_timestamp(file, &entry->interval, ','))
                {
                    state = MAX;
                }
                else
                {
                    FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                }
                break;
            case MAX:
                if (read_ahead_timestamp(file, &entry->max, ','))
                {
                    state = HISTOGRAM;
                }
                else
                {
                    FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
                }
                break;
            case HISTOGRAM:
                c = fgetc(file);
                if (c != '\r' && c != '\n' && c != EOF)
                {
                    if (base64_len == capacity)
                    {
                        capacity *= 2;
                        base64_histogram = hdr_realloc(base64_histogram, capacity * sizeof(char));
                        if (NULL == base64_histogram)
                        {
                            FAIL_AND_CLEANUP(cleanup, result, -ENOMEM);
                        }
                    }
                    base64_histogram[base64_len++] = (char) c;
                }
                else
                {
                    state = DONE;
                }
                break;

            default:
                FAIL_AND_CLEANUP(cleanup, result, -EINVAL);
        }
    }
    while (DONE != state);

    compressed_histogram = hdr_calloc(base64_len, sizeof(uint8_t));
    compressed_len = hdr_base64_decoded_len(base64_len);

    result = hdr_base64_decode(
        base64_histogram, base64_len, compressed_histogram, compressed_len);
    if (result != 0)
    {
        goto cleanup;
    }

    result = hdr_decode_compressed(compressed_histogram, compressed_len, histogram);

cleanup:
    hdr_free(base64_histogram);
    hdr_free(compressed_histogram);
    return result;
}